

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O1

void __thiscall
entityx::EntityManager::ViewIterator<entityx::EntityManager::BaseView<true>::Iterator,_true>::next
          (ViewIterator<entityx::EntityManager::BaseView<true>::Iterator,_true> *this)

{
  EntityManager *pEVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  
  uVar6 = (ulong)this->i_;
  if (uVar6 < this->capacity_) {
    pEVar1 = this->manager_;
    uVar2 = (this->mask_).super__Base_bitset<1UL>._M_w;
    lVar3 = *(long *)(pEVar1 + 0x78);
    lVar4 = *(long *)(pEVar1 + 0x80);
    sVar7 = this->free_cursor_;
    do {
      if ((ulong)(lVar4 - lVar3 >> 2) <= sVar7) {
        return;
      }
      if ((int)uVar6 != *(int *)(lVar3 + sVar7 * 4)) {
        return;
      }
      sVar7 = sVar7 + 1;
      this->free_cursor_ = sVar7;
      if ((uVar2 & ~*(ulong *)(*(long *)(pEVar1 + 0x48) + uVar6 * 8)) == 0) {
        return;
      }
      uVar5 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar5;
      this->i_ = uVar5;
    } while (uVar6 < this->capacity_);
  }
  return;
}

Assistant:

void next() {
      while (i_ < capacity_ && !predicate()) {
        ++i_;
      }

      if (i_ < capacity_) {
        Entity entity = manager_->get(manager_->create_id(i_));
        static_cast<Delegate*>(this)->next_entity(entity);
      }
    }